

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  int a;
  FuncState *fs;
  int b;
  int c;
  TString *s;
  expdesc key;
  expdesc val;
  expdesc local_a8;
  undefined1 local_68 [24];
  undefined8 local_50;
  ravi_type_map rStack_48;
  undefined1 auStack_44 [12];
  int iStack_38;
  undefined4 uStack_34;
  
  fs = ls->fs;
  lVar1 = fs->freereg;
  local_a8.u.ind.key_ravi_type_map = 0;
  local_a8.usertype = (TString *)0x0;
  local_a8._52_4_ = 0;
  local_a8.k = VVOID;
  local_a8._4_4_ = 0;
  local_a8.u.info = 0;
  local_a8.u.ind.usertype = (TString *)0x0;
  local_a8.t = 0;
  local_a8.f = 0;
  local_a8.ravi_type_map = 0xffffffff;
  auStack_44 = ZEXT412(0);
  uStack_34 = 0;
  local_68._16_8_ = 0;
  local_68._0_16_ = ZEXT816(0) << 0x40;
  local_50._0_4_ = 0;
  local_50._4_4_ = 0;
  rStack_48 = 0xffffffff;
  local_a8.pc = -1;
  iStack_38 = -1;
  local_a8._36_4_ = local_a8.u.ind.key_ravi_type_map;
  if ((ls->t).token == 0x125) {
    s = str_checkname(ls);
    local_a8.u.info = luaK_stringK(ls->fs,s);
    local_a8.t = -1;
    local_a8.f = -1;
    local_a8.k = VK;
    local_a8.ravi_type_map = 0x100;
    local_a8.usertype = (TString *)0x0;
    local_a8.pc = -1;
    local_a8.u.ind.usertype = (TString *)0x0;
  }
  else {
    yindex(ls,&local_a8);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  b = luaK_exp2RK(fs,&local_a8);
  subexpr(ls,(expdesc *)local_68,0);
  a = (cc->t->u).info;
  c = luaK_exp2RK(fs,(expdesc *)local_68);
  luaK_codeABC(fs,OP_SETTABLE,a,b,c);
  fs->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, struct ConsControl *cc) {
  /* recfield -> (NAME | '['exp1']') = exp1 */
  FuncState *fs = ls->fs;
  int reg = ls->fs->freereg;
  expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1},
          val = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int rkkey;
  if (ls->t.token == TK_NAME) {
    checklimit(fs, cc->nh, MAX_INT, "items in a constructor");
    checkname(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  rkkey = luaK_exp2RK(fs, &key);
  expr(ls, &val);
  luaK_codeABC(fs, OP_SETTABLE, cc->t->u.info, rkkey, luaK_exp2RK(fs, &val));
  fs->freereg = reg;  /* free registers */
}